

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulator.c
# Opt level: O0

_Bool al_triangulate_polygon
                (float *vertices,size_t vertex_stride,int *vertex_counts,
                _func_void_int_int_int_void_ptr *emit_triangle,void *userdata)

{
  int iVar1;
  void *__ptr;
  POLY *polygon_00;
  POLY *in_RCX;
  long in_RDX;
  _Bool ret;
  int i;
  int *splits;
  int split_count;
  int vertex_count;
  POLY polygon;
  int local_9c;
  int local_8c;
  undefined1 local_88 [16];
  long local_78;
  void *local_70;
  undefined8 local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  _Bool local_1;
  
  local_9c = 0;
  while (iVar1 = local_9c, 0 < *(int *)(in_RDX + (long)local_9c * 4)) {
    local_9c = local_9c + 1;
  }
  __ptr = malloc((long)local_9c << 2);
  if (__ptr == (void *)0x0) {
    local_1 = false;
  }
  else {
    local_8c = 0;
    for (local_9c = 0; local_9c < iVar1; local_9c = local_9c + 1) {
      local_8c = *(int *)(in_RDX + (long)local_9c * 4) + local_8c;
      *(int *)((long)__ptr + (long)local_9c * 4) = local_8c;
    }
    memset(local_88,0,0x58);
    local_78 = (long)local_8c;
    local_68 = 4;
    polygon_00 = (POLY *)(long)iVar1;
    local_70 = __ptr;
    local_1 = poly_initialize(in_RCX);
    if (local_1) {
      poly_do_triangulate(polygon_00);
      _al_list_destroy(local_48);
      _al_list_destroy(local_40);
      _al_list_destroy(local_38);
    }
    free(__ptr);
  }
  return local_1;
}

Assistant:

bool al_triangulate_polygon(
   const float* vertices, size_t vertex_stride, const int* vertex_counts,
   void (*emit_triangle)(int, int, int, void*), void* userdata)
{
   POLY polygon;
   int vertex_count;
   int split_count;
   int *splits;
   int i;
   bool ret;

   for (i = 0; vertex_counts[i] > 0; i++) {
      /* do nothing */
   }
   ASSERT(i > 0);
   split_count = i;

   splits = malloc(split_count * sizeof(int));
   if (!splits) {
      return false;
   }
   vertex_count = 0;
   for (i = 0; i < split_count; i++) {
      vertex_count += vertex_counts[i];
      splits[i] = vertex_count;
   }

   memset(&polygon, 0, sizeof(polygon));
   polygon.vertex_buffer = vertices;
   polygon.vertex_stride = vertex_stride;
   polygon.vertex_count  = vertex_count;
   polygon.split_indices = splits;
   polygon.split_stride  = sizeof(int);   /* XXX can simplify code now */
   polygon.split_count   = split_count;
   polygon.emit          = emit_triangle;
   polygon.userdata      = userdata;

   if (poly_initialize(&polygon)) {

      poly_do_triangulate(&polygon);

      _al_list_destroy(polygon.vertex_list);
      _al_list_destroy(polygon.reflex_list);
      _al_list_destroy(polygon.ear_list);

      ret = true;
   }
   else {
      ret = false;
   }

   free(splits);

   return ret;
}